

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O2

Aig_Obj_t *
Cgt_ManConstructCareCondition
          (Cgt_Man_t *p,Aig_Man_t *pNew,Aig_Obj_t *pObjLo,Vec_Ptr_t *vCopy0,Vec_Ptr_t *vCopy1)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  int iVar8;
  Vec_Ptr_t *p_00;
  
  if ((*(uint *)&pObjLo->field_0x18 & 7) != 2) {
    __assert_fail("Aig_ObjIsCi(pObjLo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtAig.c"
                  ,0xd8,
                  "Aig_Obj_t *Cgt_ManConstructCareCondition(Cgt_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  Cgt_ManDetectFanout(p->pAig,pObjLo,p->pPars->nOdcMax,p->vFanout);
  Cgt_ManCollectVisited(p->pAig,p->vFanout,p->vVisited);
  iVar8 = 0;
  while( true ) {
    p_00 = p->vVisited;
    iVar2 = p_00->nSize;
    if (iVar2 <= iVar8) {
      for (iVar8 = 0; iVar8 < iVar2; iVar8 = iVar8 + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar8);
        pAVar6 = Aig_ObjChild0CopyVec(vCopy0,pAVar5);
        pAVar7 = Aig_ObjChild1CopyVec(vCopy0,pAVar5);
        pAVar6 = Aig_And(pNew,pAVar6,pAVar7);
        Vec_PtrWriteEntry(vCopy0,pAVar5->Id,pAVar6);
        pAVar6 = Aig_ObjChild0CopyVec(vCopy1,pAVar5);
        pAVar7 = Aig_ObjChild1CopyVec(vCopy1,pAVar5);
        pAVar6 = Aig_And(pNew,pAVar6,pAVar7);
        Vec_PtrWriteEntry(vCopy1,pAVar5->Id,pAVar6);
        p_00 = p->vVisited;
        iVar2 = p_00->nSize;
      }
      pAVar5 = (Aig_Obj_t *)((ulong)pNew->pConst1 ^ 1);
      for (iVar8 = 0; iVar8 < p->vFanout->nSize; iVar8 = iVar8 + 1) {
        pvVar3 = Vec_PtrEntry(p->vFanout,iVar8);
        pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(vCopy0,*(int *)((long)pvVar3 + 0x24));
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(vCopy1,*(int *)((long)pvVar3 + 0x24));
        pAVar6 = Aig_Exor(pNew,pAVar6,pAVar7);
        pAVar5 = Aig_Or(pNew,pAVar5,pAVar6);
      }
      return pAVar5;
    }
    pvVar3 = Vec_PtrEntry(p_00,iVar8);
    if ((*(uint *)((long)pvVar3 + 0x18) & 7) - 7 < 0xfffffffe) break;
    iVar1 = Saig_ObjIsPi(p->pAig,(Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe));
    iVar2 = -1;
    if (iVar1 != 0) {
      iVar1 = iVar2;
      if (*(ulong *)((long)pvVar3 + 8) != 0) {
        iVar1 = *(int *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x24);
      }
      pvVar4 = Vec_PtrEntry(vCopy0,iVar1);
      if (pvVar4 == (void *)0x0) {
        pAVar5 = Aig_ObjCreateCi(pNew);
        iVar1 = iVar2;
        if (*(ulong *)((long)pvVar3 + 8) != 0) {
          iVar1 = *(int *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x24);
        }
        Vec_PtrWriteEntry(vCopy0,iVar1,pAVar5);
        iVar1 = iVar2;
        if (*(ulong *)((long)pvVar3 + 8) != 0) {
          iVar1 = *(int *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x24);
        }
        Vec_PtrWriteEntry(vCopy1,iVar1,pAVar5);
      }
    }
    iVar1 = Saig_ObjIsPi(p->pAig,(Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe)
                        );
    if (iVar1 != 0) {
      iVar1 = iVar2;
      if (*(ulong *)((long)pvVar3 + 0x10) != 0) {
        iVar1 = *(int *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x24);
      }
      pvVar4 = Vec_PtrEntry(vCopy0,iVar1);
      if (pvVar4 == (void *)0x0) {
        pAVar5 = Aig_ObjCreateCi(pNew);
        iVar1 = iVar2;
        if (*(ulong *)((long)pvVar3 + 0x10) != 0) {
          iVar1 = *(int *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x24);
        }
        Vec_PtrWriteEntry(vCopy0,iVar1,pAVar5);
        if (*(ulong *)((long)pvVar3 + 0x10) != 0) {
          iVar2 = *(int *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x24);
        }
        Vec_PtrWriteEntry(vCopy1,iVar2,pAVar5);
      }
    }
    iVar8 = iVar8 + 1;
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtAig.c"
                ,0xdf,
                "Aig_Obj_t *Cgt_ManConstructCareCondition(Cgt_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
               );
}

Assistant:

Aig_Obj_t * Cgt_ManConstructCareCondition( Cgt_Man_t * p, Aig_Man_t * pNew, Aig_Obj_t * pObjLo, Vec_Ptr_t * vCopy0, Vec_Ptr_t * vCopy1 )
{
    Aig_Obj_t * pMiter, * pObj, * pTemp;
    int i;
    assert( Aig_ObjIsCi(pObjLo) );
    // detect nodes and their cone
    Cgt_ManDetectFanout( p->pAig, pObjLo, p->pPars->nOdcMax, p->vFanout );
    Cgt_ManCollectVisited( p->pAig, p->vFanout, p->vVisited );
    // add new variables if the observability condition depends on PI variables
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vVisited, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        if ( Saig_ObjIsPi(p->pAig, Aig_ObjFanin0(pObj)) && Vec_PtrEntry(vCopy0, Aig_ObjFaninId0(pObj)) == NULL )
        {
            pTemp = Aig_ObjCreateCi( pNew );
            Vec_PtrWriteEntry( vCopy0, Aig_ObjFaninId0(pObj), pTemp );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjFaninId0(pObj), pTemp );
        }
        if ( Saig_ObjIsPi(p->pAig, Aig_ObjFanin1(pObj)) && Vec_PtrEntry(vCopy0, Aig_ObjFaninId1(pObj)) == NULL )
        {
            pTemp = Aig_ObjCreateCi( pNew );
            Vec_PtrWriteEntry( vCopy0, Aig_ObjFaninId1(pObj), pTemp );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjFaninId1(pObj), pTemp );
        }
    }
    // construct AIGs for the nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vVisited, pObj, i )
    {
        pTemp = Aig_And( pNew, Aig_ObjChild0CopyVec(vCopy0, pObj), Aig_ObjChild1CopyVec(vCopy0, pObj) );
        Vec_PtrWriteEntry( vCopy0, Aig_ObjId(pObj), pTemp );
        pTemp = Aig_And( pNew, Aig_ObjChild0CopyVec(vCopy1, pObj), Aig_ObjChild1CopyVec(vCopy1, pObj) );
        Vec_PtrWriteEntry( vCopy1, Aig_ObjId(pObj), pTemp );
    }
    // construct the care miter
    pMiter = Aig_ManConst0( pNew );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanout, pObj, i )
    {
        pTemp = Aig_Exor( pNew, (Aig_Obj_t *)Vec_PtrEntry(vCopy0, Aig_ObjId(pObj)), (Aig_Obj_t *)Vec_PtrEntry(vCopy1, Aig_ObjId(pObj)) );
        pMiter = Aig_Or( pNew, pMiter, pTemp );
    }
    return pMiter;
}